

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Configuration.cpp
# Opt level: O0

void __thiscall Corrade::Utility::Configuration::Configuration(Configuration *this,Flags flags)

{
  InternalFlag value;
  Configuration *this_local;
  Flags flags_local;
  
  this_local._4_4_ = flags._value;
  ConfigurationGroup::ConfigurationGroup(&this->super_ConfigurationGroup,this);
  std::__cxx11::string::string((string *)&this->_filename);
  value = Containers::EnumSet::operator_cast_to_unsigned_int((EnumSet *)((long)&this_local + 4));
  Containers::EnumSet<Corrade::Utility::Configuration::InternalFlag,_4294967295U>::EnumSet
            (&this->_flags,value);
  return;
}

Assistant:

Configuration::Configuration(const Flags flags): ConfigurationGroup(this), _flags(static_cast<InternalFlag>(std::uint32_t(flags))) {}